

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# po_man.cpp
# Opt level: O1

void PO_Init(void)

{
  TArray<vertex_t_*,_vertex_t_*> *this;
  BYTE *pBVar1;
  FPolyObj *this_00;
  undefined8 *puVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  short sVar6;
  uint uVar7;
  long lVar8;
  line_t_conflict *plVar9;
  vertex_t *pvVar10;
  side_t **ppsVar11;
  line_t_conflict **pplVar12;
  vertex_t **ppvVar13;
  FPolyVertex *pFVar14;
  double *pdVar15;
  undefined1 auVar16 [16];
  double dVar17;
  node_t *pnVar18;
  DWORD DVar19;
  ulong *puVar20;
  subsector_t *psVar21;
  byte bVar22;
  uint uVar23;
  int *piVar24;
  polyspawns_t *ppVar25;
  int iVar26;
  ulong uVar27;
  polyspawns_t *ppVar28;
  ulong uVar29;
  polyspawns_t *ppVar30;
  size_t sVar31;
  int iVar32;
  side_t *psVar33;
  uint uVar34;
  long lVar35;
  FPolyObj *pFVar36;
  side_t *psVar37;
  long lVar38;
  bool bVar39;
  double dVar40;
  TArray<side_t_*,_side_t_*> local_48;
  
  if (0 < numsides) {
    lVar38 = 0xa0;
    lVar35 = 0;
    do {
      lVar8 = *(long *)((long)sides->textures + lVar38 + -0x10);
      if ((lVar8 != 0) && ((*(uint *)(lVar8 + 0x28) | 4) == 5)) {
        TArray<int,_int>::Grow(&KnownPolySides,1);
        KnownPolySides.Array[KnownPolySides.Count] = (int)lVar35;
        KnownPolySides.Count = KnownPolySides.Count + 1;
      }
      lVar35 = lVar35 + 1;
      lVar38 = lVar38 + 0xc0;
    } while (lVar35 < numsides);
  }
  uVar27 = (ulong)po_NumPolyobjs;
  auVar16._8_8_ = 0;
  auVar16._0_8_ = uVar27;
  uVar29 = 0xffffffffffffffff;
  if (SUB168(auVar16 * ZEXT816(0xf0),8) == 0) {
    uVar29 = SUB168(auVar16 * ZEXT816(0xf0),0) | 8;
  }
  puVar20 = (ulong *)operator_new__(uVar29);
  polyobjs = (FPolyObj *)(puVar20 + 1);
  *puVar20 = uVar27;
  if (uVar27 != 0) {
    lVar35 = 0;
    do {
      puVar2 = (undefined8 *)((long)puVar20 + lVar35 + 0x48);
      *puVar2 = 0;
      puVar2[1] = 0;
      puVar2 = (undefined8 *)((long)puVar20 + lVar35 + 0x38);
      *puVar2 = 0;
      puVar2[1] = 0;
      puVar2 = (undefined8 *)((long)puVar20 + lVar35 + 0x28);
      *puVar2 = 0;
      puVar2[1] = 0;
      puVar2 = (undefined8 *)((long)puVar20 + lVar35 + 0x18);
      *puVar2 = 0;
      puVar2[1] = 0;
      puVar2 = (undefined8 *)((long)puVar20 + lVar35 + 8);
      *puVar2 = 0;
      puVar2[1] = 0;
      *(undefined8 *)((long)puVar20 + lVar35 + 0x90) = 0xc7efffffe0000000;
      *(undefined8 *)((long)puVar20 + lVar35 + 0x78) = 0xc7efffffe0000000;
      *(undefined8 *)((long)puVar20 + lVar35 + 0x88) = 0x47efffffe0000000;
      *(undefined8 *)((long)puVar20 + lVar35 + 0x80) = 0x47efffffe0000000;
      *(undefined4 *)((long)puVar20 + lVar35 + 0xd0) = 0;
      puVar2 = (undefined8 *)((long)puVar20 + lVar35 + 0x58);
      *puVar2 = 0;
      puVar2[1] = 0;
      puVar2 = (undefined8 *)((long)puVar20 + lVar35 + 0xa8);
      *puVar2 = 0;
      puVar2[1] = 0;
      puVar2 = (undefined8 *)((long)puVar20 + lVar35 + 0xb8);
      *puVar2 = 0;
      puVar2[1] = 0;
      *(undefined8 *)((long)puVar20 + lVar35 + 0xc6) = 0;
      puVar2 = (undefined8 *)((long)puVar20 + lVar35 + 0xd8);
      *puVar2 = 0;
      puVar2[1] = 0;
      puVar2 = (undefined8 *)((long)puVar20 + lVar35 + 0xe8);
      *puVar2 = 0;
      puVar2[1] = 0;
      lVar35 = lVar35 + 0xf0;
    } while (uVar27 * 0xf0 - lVar35 != 0);
  }
  ppVar30 = polyspawns;
  if (polyspawns != (polyspawns_t *)0x0) {
    iVar32 = 0;
    ppVar25 = polyspawns;
    ppVar28 = (polyspawns_t *)&polyspawns;
    do {
      pFVar36 = polyobjs;
      sVar6 = ppVar25->type;
      ppVar30 = ppVar25;
      if ((ushort)(sVar6 - 0xcU) < 3) {
        this_00 = polyobjs + iVar32;
        polyobjs[iVar32].StartSpot.pos.Y = (ppVar25->pos).Y;
        pFVar36[iVar32].StartSpot.pos.X = (ppVar25->pos).X;
        piVar24 = KnownPolySides.Array;
        psVar33 = sides;
        uVar34 = (uint)ppVar25->angle;
        uVar29 = (ulong)KnownPolySides.Count;
        if (uVar29 != 0) {
          uVar27 = 0;
LAB_00472b89:
          lVar35 = (long)piVar24[uVar27];
          if (lVar35 < 0) goto LAB_00472bb7;
          this_00->bBlocked = false;
          this_00->bHasPortals = '\0';
          plVar9 = psVar33[lVar35].linedef;
          if ((plVar9->special != 1) || (plVar9->args[0] != uVar34)) goto LAB_00472bb7;
          if ((this_00->Sidedefs).Count != 0) {
            I_Error("SpawnPolyobj: Polyobj %d already spawned.\n");
          }
          psVar33 = psVar33 + lVar35;
          plVar9 = psVar33->linedef;
          plVar9->special = 0;
          plVar9->args[0] = 0;
          pFVar36 = polyobjs + iVar32;
          if (IterFindPolySides(FPolyObj*,side_t*)::vnum == '\0') {
            PO_Init();
          }
          if (sidetemp == (sidei_t *)0x0) {
            __assert_fail("sidetemp != NULL",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/po_man.cpp"
                          ,0x5d3,"void IterFindPolySides(FPolyObj *, side_t *)");
          }
          if (DAT_017f4adc != 0) {
            DAT_017f4adc = 0;
          }
          uVar29 = *(long *)(psVar33->linedef->args +
                            (ulong)(psVar33->linedef->sidedef[0] != psVar33) * 2 + -0xb) -
                   (long)vertexes;
          TArray<unsigned_int,_unsigned_int>::Grow
                    ((TArray<unsigned_int,_unsigned_int> *)
                     &IterFindPolySides(FPolyObj*,side_t*)::vnum,1);
          *(int *)(IterFindPolySides(FPolyObj*,side_t*)::vnum + (ulong)DAT_017f4adc * 4) =
               (int)(uVar29 >> 4);
          DAT_017f4adc = DAT_017f4adc + 1;
          if (DAT_017f4adc != 0) {
            uVar23 = 0;
            do {
              for (DVar19 = sidetemp[*(uint *)(IterFindPolySides(FPolyObj*,side_t*)::vnum +
                                              (ulong)uVar23 * 4)].field_0.b.first;
                  DVar19 != 0xffffffff; DVar19 = sidetemp[DVar19].field_0.b.next) {
                psVar37 = sides + DVar19;
                TArray<side_t_*,_side_t_*>::Grow(&pFVar36->Sidedefs,1);
                uVar7 = (pFVar36->Sidedefs).Count;
                (pFVar36->Sidedefs).Array[uVar7] = psVar37;
                (pFVar36->Sidedefs).Count = uVar7 + 1;
                uVar29 = (ulong)(DAT_017f4adc - 1);
                do {
                  bVar39 = uVar29 == 0;
                  uVar29 = uVar29 - 1;
                  iVar26 = (int)((ulong)(*(long *)((sides[DVar19].linedef)->args +
                                                  (ulong)((sides[DVar19].linedef)->sidedef[0] ==
                                                         sides + DVar19) * 2 + -0xb) -
                                        (long)vertexes) >> 4);
                  if (bVar39) {
                    TArray<unsigned_int,_unsigned_int>::Grow
                              ((TArray<unsigned_int,_unsigned_int> *)
                               &IterFindPolySides(FPolyObj*,side_t*)::vnum,1);
                    *(int *)(IterFindPolySides(FPolyObj*,side_t*)::vnum + (ulong)DAT_017f4adc * 4) =
                         iVar26;
                    DAT_017f4adc = DAT_017f4adc + 1;
                    break;
                  }
                } while (*(int *)(IterFindPolySides(FPolyObj*,side_t*)::vnum + uVar29 * 4) != iVar26
                        );
              }
              uVar23 = uVar23 + 1;
            } while (DAT_017f4adc != uVar23);
          }
          plVar9 = psVar33->linedef;
          this_00->MirrorNum = plVar9->args[1];
          this_00->crush = (uint)(sVar6 != 0xc) * 3;
          this_00->bHurtOnTouch = sVar6 == 0xe;
          this_00->tag = uVar34;
          uVar23 = plVar9->args[2];
          if (0x3f < uVar23) {
            uVar23 = 0;
          }
          this_00->seqType = uVar23;
        }
LAB_00472ded:
        if ((this_00->Sidedefs).Count == 0) {
          local_48.Array = (side_t **)0x0;
          local_48.Most = 0;
          local_48.Count = 0;
          if (KnownPolySides.Count != 0) {
            uVar29 = 0;
            do {
              lVar35 = (long)KnownPolySides.Array[uVar29];
              if (((-1 < lVar35) && (plVar9 = sides[lVar35].linedef, plVar9->special == 5)) &&
                 (plVar9->args[0] == uVar34)) {
                if (plVar9->args[1] == 0) {
                  I_Error("SpawnPolyobj: Explicit line missing order number in poly %d, linedef %d.\n"
                          ,(ulong)uVar34,
                          (ulong)(uint)((int)((ulong)((long)plVar9 - (long)lines) >> 3) * 0x286bca1b
                                       ));
                }
                psVar33 = sides;
                TArray<side_t_*,_side_t_*>::Grow(&this_00->Sidedefs,1);
                uVar23 = (this_00->Sidedefs).Count;
                (this_00->Sidedefs).Array[uVar23] = psVar33 + lVar35;
                (this_00->Sidedefs).Count = uVar23 + 1;
              }
              uVar29 = uVar29 + 1;
            } while (uVar29 < KnownPolySides.Count);
          }
          qsort((this_00->Sidedefs).Array,(ulong)(this_00->Sidedefs).Count,8,posicmp);
          if ((this_00->Sidedefs).Count == 0) {
            I_Error("SpawnPolyobj: Poly %d does not exist\n");
          }
          else {
            this_00->crush = (uint)(sVar6 != 0xc) * 3;
            this_00->bHurtOnTouch = sVar6 == 0xe;
            this_00->tag = uVar34;
            plVar9 = (*(this_00->Sidedefs).Array)->linedef;
            this_00->seqType = plVar9->args[3];
            this_00->MirrorNum = plVar9->args[2];
          }
          TArray<side_t_*,_side_t_*>::~TArray(&local_48);
        }
        validcount = validcount + 1;
        if ((this_00->Sidedefs).Count != 0) {
          this = &this_00->Vertices;
          uVar29 = 0;
          do {
            iVar26 = validcount;
            plVar9 = (this_00->Sidedefs).Array[uVar29]->linedef;
            if (plVar9->validcount != validcount) {
              uVar34 = plVar9->portalindex;
              if (((linePortals.Array != (FLinePortal *)0x0 && uVar34 < linePortals.Count) &&
                  ((linePortals.Array[uVar34].mDefFlags & 2) != 0)) &&
                 (bVar22 = (linePortals.Array[uVar34].mType == '\x03') + 1,
                 this_00->bHasPortals < bVar22)) {
                this_00->bHasPortals = bVar22;
              }
              plVar9->validcount = iVar26;
              TArray<line_t_*,_line_t_*>::Grow(&this_00->Linedefs,1);
              uVar34 = (this_00->Linedefs).Count;
              (this_00->Linedefs).Array[uVar34] = plVar9;
              (this_00->Linedefs).Count = uVar34 + 1;
              pvVar10 = plVar9->v1;
              uVar34 = (this_00->Vertices).Count;
              do {
                uVar34 = uVar34 - 1;
                if ((int)uVar34 < 0) {
                  TArray<vertex_t_*,_vertex_t_*>::Grow(this,1);
                  uVar34 = (this_00->Vertices).Count;
                  (this_00->Vertices).Array[uVar34] = pvVar10;
                  (this_00->Vertices).Count = uVar34 + 1;
                  break;
                }
              } while (this->Array[uVar34 & 0x7fffffff] != pvVar10);
              pvVar10 = plVar9->v2;
              uVar34 = (this_00->Vertices).Count;
              do {
                uVar34 = uVar34 - 1;
                if ((int)uVar34 < 0) {
                  TArray<vertex_t_*,_vertex_t_*>::Grow(this,1);
                  uVar34 = (this_00->Vertices).Count;
                  (this_00->Vertices).Array[uVar34] = pvVar10;
                  (this_00->Vertices).Count = uVar34 + 1;
                  break;
                }
              } while (this->Array[uVar34 & 0x7fffffff] != pvVar10);
            }
            uVar29 = uVar29 + 1;
          } while (uVar29 < (this_00->Sidedefs).Count);
        }
        TArray<side_t_*,_side_t_*>::ShrinkToFit(&this_00->Sidedefs);
        TArray<line_t_*,_line_t_*>::ShrinkToFit(&this_00->Linedefs);
        TArray<vertex_t_*,_vertex_t_*>::ShrinkToFit(&this_00->Vertices);
        iVar32 = iVar32 + 1;
        ppVar28->next = ppVar25->next;
        operator_delete(ppVar25,0x20);
        ppVar30 = ppVar28;
      }
      ppVar25 = ppVar30->next;
      ppVar28 = ppVar30;
      ppVar30 = polyspawns;
    } while (ppVar25 != (polyspawns_t *)0x0);
  }
  while (ppVar30 != (polyspawns_t *)0x0) {
    ppVar25 = ppVar30->next;
    if (ppVar30->type == 0xb) {
      uVar34 = (uint)ppVar30->angle;
      lVar35 = (long)po_NumPolyobjs;
      pFVar36 = polyobjs;
      if (0 < lVar35) {
        do {
          if (pFVar36->tag == uVar34) goto LAB_00473146;
          lVar35 = lVar35 + -1;
          pFVar36 = pFVar36 + 1;
        } while (lVar35 != 0);
      }
      pFVar36 = (FPolyObj *)0x0;
LAB_00473146:
      if (pFVar36 == (FPolyObj *)0x0) {
        I_Error("TranslateToStartSpot: Unable to match polyobj tag: %d\n",(ulong)uVar34);
      }
      if ((pFVar36->Sidedefs).Count == 0) {
        I_Error("TranslateToStartSpot: Anchor point located without a StartSpot point: %d\n",
                (ulong)uVar34);
      }
      TArray<FPolyVertex,_FPolyVertex>::Resize(&pFVar36->OriginalPts,(pFVar36->Sidedefs).Count);
      TArray<FPolyVertex,_FPolyVertex>::Resize(&pFVar36->PrevPts,(pFVar36->Sidedefs).Count);
      dVar17 = (ppVar30->pos).X - (pFVar36->StartSpot).pos.X;
      dVar40 = (ppVar30->pos).Y - (pFVar36->StartSpot).pos.Y;
      uVar29 = (ulong)(pFVar36->Sidedefs).Count;
      if (uVar29 != 0) {
        ppsVar11 = (pFVar36->Sidedefs).Array;
        uVar27 = 0;
        do {
          pBVar1 = &ppsVar11[uVar27]->Flags;
          *pBVar1 = *pBVar1 | 0x40;
          uVar27 = uVar27 + 1;
        } while (uVar29 != uVar27);
      }
      uVar29 = (ulong)(pFVar36->Linedefs).Count;
      if (uVar29 != 0) {
        pplVar12 = (pFVar36->Linedefs).Array;
        uVar27 = 0;
        do {
          plVar9 = pplVar12[uVar27];
          dVar3 = plVar9->bbox[1];
          plVar9->bbox[0] = plVar9->bbox[0] - dVar40;
          plVar9->bbox[1] = dVar3 - dVar40;
          plVar9->bbox[2] = plVar9->bbox[2] - dVar17;
          plVar9->bbox[3] = plVar9->bbox[3] - dVar17;
          uVar27 = uVar27 + 1;
        } while (uVar29 != uVar27);
      }
      uVar29 = (ulong)(pFVar36->Vertices).Count;
      if (uVar29 != 0) {
        ppvVar13 = (pFVar36->Vertices).Array;
        pFVar14 = (pFVar36->OriginalPts).Array;
        lVar35 = 0;
        do {
          pdVar15 = *(double **)((long)ppvVar13 + lVar35);
          dVar3 = *pdVar15;
          dVar4 = pdVar15[1];
          *pdVar15 = dVar3 - dVar17;
          pdVar15[1] = dVar4 - dVar40;
          dVar5 = (pFVar36->StartSpot).pos.X;
          *(double *)((long)&(pFVar14->pos).Y + lVar35 * 2) =
               (dVar4 - dVar40) - (pFVar36->StartSpot).pos.Y;
          *(double *)((long)&(pFVar14->pos).X + lVar35 * 2) = (dVar3 - dVar17) - dVar5;
          lVar35 = lVar35 + 8;
        } while (uVar29 << 3 != lVar35);
      }
      FPolyObj::CalcCenter(pFVar36);
      psVar21 = R_PointInSubsector(SUB84((pFVar36->CenterSpot).pos.X + 103079215104.0,0),
                                   SUB84((pFVar36->CenterSpot).pos.Y + 103079215104.0,0));
      pFVar36->CenterSubsector = psVar21;
    }
    operator_delete(ppVar30,0x20);
    ppVar30 = ppVar25;
  }
  polyspawns = (polyspawns_t *)0x0;
  if (po_NumPolyobjs < 1) {
    sVar31 = (long)bmapheight * (long)bmapwidth * 8;
    uVar29 = 0xffffffffffffffff;
    if (-1 < (int)((long)bmapheight * (long)bmapwidth)) {
      uVar29 = sVar31;
    }
    PolyBlockMap = (polyblock_t **)operator_new__(uVar29);
    memset(PolyBlockMap,0,sVar31);
  }
  else {
    lVar38 = 0xa8;
    lVar35 = 0;
    do {
      if (*(int *)((long)polyobjs + lVar38 + -0x6c) == 0) {
        I_Error("PO_Init: StartSpot located without an Anchor point: %d\n");
      }
      iVar32 = po_NumPolyobjs;
      lVar35 = lVar35 + 1;
      lVar38 = lVar38 + 0xf0;
    } while (lVar35 < po_NumPolyobjs);
    sVar31 = (long)bmapheight * (long)bmapwidth * 8;
    uVar29 = 0xffffffffffffffff;
    if (-1 < (int)((long)bmapheight * (long)bmapwidth)) {
      uVar29 = sVar31;
    }
    PolyBlockMap = (polyblock_t **)operator_new__(uVar29);
    memset(PolyBlockMap,0,sVar31);
    if (0 < iVar32) {
      lVar35 = 0;
      lVar38 = 0;
      do {
        FPolyObj::LinkPolyobj((FPolyObj *)((long)(polyobjs->Bounds).m_Box + lVar35 + -0x70));
        lVar38 = lVar38 + 1;
        lVar35 = lVar35 + 0xf0;
      } while (lVar38 < po_NumPolyobjs);
    }
  }
  if (KnownPolySides.Count != 0) {
    KnownPolySides.Count = 0;
  }
  TArray<int,_int>::ShrinkToFit(&KnownPolySides);
  if (0 < numnodes) {
    lVar35 = 8;
    lVar38 = 0;
    do {
      pnVar18 = nodes;
      dVar40 = (double)*(int *)((long)&nodes->x + lVar35) * 1.52587890625e-05;
      dVar17 = (double)*(int *)((long)&nodes->y + lVar35) * 1.52587890625e-05;
      dVar17 = c_sqrt(dVar17 * dVar17 + dVar40 * dVar40);
      *(float *)((long)&pnVar18->field_4 + lVar35 + 0x18) = (float)dVar17;
      lVar38 = lVar38 + 1;
      lVar35 = lVar35 + 0x48;
    } while (lVar38 < numnodes);
  }
  psVar21 = subsectors;
  if (0 < numsubsectors) {
    lVar35 = 0;
    do {
      if ((ulong)psVar21[lVar35].numlines != 0) {
        lVar38 = 0;
        do {
          lVar8 = *(long *)((long)&(psVar21[lVar35].firstline)->sidedef + lVar38);
          if ((lVar8 != 0) && ((*(byte *)(lVar8 + 0xb4) & 0x40) != 0)) {
            *(byte *)&psVar21[lVar35].flags = (byte)psVar21[lVar35].flags | 4;
            break;
          }
          lVar38 = lVar38 + 0x30;
        } while ((ulong)psVar21[lVar35].numlines * 0x30 != lVar38);
      }
      lVar35 = lVar35 + 1;
    } while (lVar35 < numsubsectors);
  }
  if (0 < numlines) {
    piVar24 = &lines->special;
    lVar35 = 0;
    do {
      if ((*piVar24 | 4U) == 5) {
        *piVar24 = 0;
      }
      lVar35 = lVar35 + 1;
      piVar24 = piVar24 + 0x26;
    } while (lVar35 < numlines);
  }
  return;
LAB_00472bb7:
  uVar27 = uVar27 + 1;
  if (uVar29 == uVar27) goto LAB_00472ded;
  goto LAB_00472b89;
}

Assistant:

static void InitSideLists ()
{
	for (int i = 0; i < numsides; ++i)
	{
		if (sides[i].linedef != NULL &&
			(sides[i].linedef->special == Polyobj_StartLine ||
			 sides[i].linedef->special == Polyobj_ExplicitLine))
		{
			KnownPolySides.Push (i);
		}
	}
}